

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_Addition_Test::TEST_SimpleString_Addition_Test
          (TEST_SimpleString_Addition_Test *this)

{
  TEST_SimpleString_Addition_Test *this_local;
  
  memset(this,0,0x38);
  TEST_GROUP_CppUTestGroupSimpleString::TEST_GROUP_CppUTestGroupSimpleString
            (&this->super_TEST_GROUP_CppUTestGroupSimpleString);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_SimpleString_Addition_Test_003e89d8;
  return;
}

Assistant:

TEST(SimpleString, Addition)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 = s1 + s2;

    CHECK_EQUAL(s3, s4);
}